

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_path_builder_delegate.cc
# Opt level: O1

bool __thiscall
bssl::SimplePathBuilderDelegate::IsSignatureAlgorithmAcceptable
          (SimplePathBuilderDelegate *this,SignatureAlgorithm algorithm,CertErrors *errors)

{
  if (kMaxValue < algorithm) {
    return false;
  }
  if ((0x7eeU >> (algorithm & 0x1f) & 1) != 0) {
    return true;
  }
  return this->digest_policy_ == kMaxValue;
}

Assistant:

bool SimplePathBuilderDelegate::IsSignatureAlgorithmAcceptable(
    SignatureAlgorithm algorithm, CertErrors *errors) {
  switch (algorithm) {
    case SignatureAlgorithm::kRsaPkcs1Sha1:
    case SignatureAlgorithm::kEcdsaSha1:
      return digest_policy_ == DigestPolicy::kWeakAllowSha1;

    case SignatureAlgorithm::kRsaPkcs1Sha256:
    case SignatureAlgorithm::kRsaPkcs1Sha384:
    case SignatureAlgorithm::kRsaPkcs1Sha512:
    case SignatureAlgorithm::kEcdsaSha256:
    case SignatureAlgorithm::kEcdsaSha384:
    case SignatureAlgorithm::kEcdsaSha512:
    case SignatureAlgorithm::kRsaPssSha256:
    case SignatureAlgorithm::kRsaPssSha384:
    case SignatureAlgorithm::kRsaPssSha512:
      return true;
  }
  return false;
}